

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O0

int AF_ACustomBridge_A_BridgeInit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  int local_84;
  bool local_7b;
  TAngle<double> local_78;
  DVector3 local_70;
  int local_58;
  int local_54;
  int i;
  int ballcount;
  DAngle startangle;
  AActor *ball;
  MetaClass *balltype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                  ,0x7f,
                  "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    this = (AActor *)(param->field_0).field_1.a;
    local_7b = true;
    if (this != (AActor *)0x0) {
      local_7b = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_7b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                    ,0x7f,
                    "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 2) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      bVar3 = false;
      if ((pVVar2->field_0).field_3.Type == '\x03') {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        bVar3 = true;
        if ((pVVar2->field_0).field_1.atag != 1) {
          pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
          bVar3 = (pVVar2->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar3) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                      ,0x80,
                      "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      ball = (AActor *)(pVVar2->field_0).field_1.a;
    }
    else {
      bVar3 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
        bVar3 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                      ,0x80,
                      "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      ball = (AActor *)param[1].field_0.field_1.a;
    }
    if (ball == (AActor *)0x0) {
      ball = (AActor *)PClass::FindActor("BridgeBall");
    }
    iVar1 = FRandom::operator()(&pr_orbit);
    TAngle<double>::TAngle((TAngle<double> *)&i,(double)iVar1 * 1.40625);
    if (this->args[2] == 0) {
      local_84 = 3;
    }
    else {
      local_84 = this->args[2];
    }
    local_54 = local_84;
    for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
      AActor::Pos(&local_70,this);
      startangle.Degrees = (double)Spawn((PClassActor *)ball,&local_70,ALLOW_REPLACE);
      TAngle<double>::operator+
                (&local_78,(double)(int)(0x100 / (long)local_54) * 1.40625 * (double)local_58);
      TAngle<double>::operator=((TAngle<double> *)((long)startangle.Degrees + 0xb0),&local_78);
      TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)startangle.Degrees + 0x208),this);
      BridgeOrbit((AActor *)startangle.Degrees);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                ,0x7f,
                "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(ACustomBridge, A_BridgeInit)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(balltype, AActor);

	AActor *ball;

	if (balltype == NULL)
	{
		balltype = PClass::FindActor("BridgeBall");
	}

	DAngle startangle = pr_orbit() * (360./256.);

	// Spawn triad into world -- may be more than a triad now.
	int ballcount = self->args[2]==0 ? 3 : self->args[2];

	for (int i = 0; i < ballcount; i++)
	{
		ball = Spawn(balltype, self->Pos(), ALLOW_REPLACE);
		ball->Angles.Yaw = startangle + (45./32) * (256/ballcount) * i;
		ball->target = self;
		BridgeOrbit(ball);
	}
	return 0;
}